

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O0

void __thiscall
util::exception::exception<char_const(&)[20],CylHead&,char_const(&)[6]>
          (exception *this,char (*args) [20],CylHead *args_1,char (*args_2) [6])

{
  char (*in_R8) [6];
  string local_48;
  char (*local_28) [6];
  char (*args_local_2) [6];
  CylHead *args_local_1;
  char (*args_local) [20];
  exception *this_local;
  
  local_28 = args_2;
  args_local_2 = (char (*) [6])args_1;
  args_local_1 = (CylHead *)args;
  args_local = (char (*) [20])this;
  make_string<char_const(&)[20],CylHead&,char_const(&)[6]>
            (&local_48,(util *)args,(char (*) [20])args_1,(CylHead *)args_2,in_R8);
  std::runtime_error::runtime_error(&this->super_runtime_error,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  *(undefined ***)this = &PTR__exception_00301e18;
  return;
}

Assistant:

explicit exception(Args&& ... args)
        : std::runtime_error(make_string(std::forward<Args>(args)...)) {}